

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableLayout.cpp
# Opt level: O2

QSize __thiscall KDReports::TableLayout::decorationSize(TableLayout *this,QVariant *cellDecoration)

{
  char cVar1;
  QSize QVar2;
  QPixmap pix;
  QImage img;
  undefined1 auStack_48 [48];
  
  qvariant_cast<QImage>((QVariant *)(auStack_48 + 0x18));
  cVar1 = QImage::isNull();
  if (cVar1 == '\0') {
    QVar2 = (QSize)QImage::size();
  }
  else {
    qvariant_cast<QPixmap>((QVariant *)auStack_48);
    cVar1 = QPixmap::isNull();
    if (cVar1 == '\0') {
      QVar2 = (QSize)QPixmap::size();
    }
    else {
      QVar2 = this->m_iconSize;
    }
    QPixmap::~QPixmap((QPixmap *)auStack_48);
  }
  QImage::~QImage((QImage *)(auStack_48 + 0x18));
  return QVar2;
}

Assistant:

QSize KDReports::TableLayout::decorationSize(const QVariant &cellDecoration) const
{
    QImage img = qvariant_cast<QImage>(cellDecoration);
    if (!img.isNull()) {
        return img.size();
    }
    QPixmap pix = qvariant_cast<QPixmap>(cellDecoration);
    if (!pix.isNull()) {
        return pix.size();
    }
    return m_iconSize;
}